

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

bool LowererMD::HoistLargeConstant(IndirOpnd *indirOpnd,Opnd *src,Instr *instr)

{
  int32 iVar1;
  RegOpnd *pRVar2;
  RegOpnd *regOpnd;
  Instr *instr_local;
  Opnd *src_local;
  IndirOpnd *indirOpnd_local;
  
  if (indirOpnd == (IndirOpnd *)0x0) {
    indirOpnd_local._7_1_ = false;
  }
  else {
    iVar1 = IR::IndirOpnd::GetOffset(indirOpnd);
    if (iVar1 == 0) {
      pRVar2 = IR::IndirOpnd::GetBaseOpnd(indirOpnd);
      IR::Instr::ReplaceSrc(instr,src,&pRVar2->super_Opnd);
    }
    else {
      pRVar2 = IR::RegOpnd::New(TyUint64,instr->m_func);
      Lowerer::InsertLea(pRVar2,&indirOpnd->super_Opnd,instr);
      IR::Instr::ReplaceSrc(instr,src,&pRVar2->super_Opnd);
    }
    indirOpnd_local._7_1_ = true;
  }
  return indirOpnd_local._7_1_;
}

Assistant:

bool LowererMD::HoistLargeConstant(IR::IndirOpnd *indirOpnd, IR::Opnd *src, IR::Instr *instr) {
        if (indirOpnd != nullptr)
        {
            if (indirOpnd->GetOffset() == 0)
            {
                instr->ReplaceSrc(src, indirOpnd->GetBaseOpnd());
            }
            else
            {
                // Hoist the address load as LEA [reg + offset]
                // with the reg = MOV <some address within 32-bit range at the start of the function
                IR::RegOpnd * regOpnd = IR::RegOpnd::New(TyMachPtr, instr->m_func);
                Lowerer::InsertLea(regOpnd, indirOpnd, instr);
                instr->ReplaceSrc(src, regOpnd);
            }
            return true;
        }
        return false;
}